

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void term_print_flush(Terminal *term)

{
  bufchain *ch;
  size_t sVar1;
  ulong len;
  ptrlen pVar2;
  
  ch = &term->printer_buf;
  while( true ) {
    sVar1 = bufchain_size(ch);
    if (sVar1 < 6) break;
    pVar2 = bufchain_prefix(ch);
    len = sVar1 - 5;
    if (pVar2.len < sVar1 - 5) {
      len = pVar2.len;
    }
    printer_job_data(term->print_job,pVar2.ptr,len);
    bufchain_consume(ch,len);
  }
  return;
}

Assistant:

static void term_print_flush(Terminal *term)
{
    size_t size;
    while ((size = bufchain_size(&term->printer_buf)) > 5) {
        ptrlen data = bufchain_prefix(&term->printer_buf);
        if (data.len > size-5)
            data.len = size-5;
        printer_job_data(term->print_job, data.ptr, data.len);
        bufchain_consume(&term->printer_buf, data.len);
    }
}